

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conn.c
# Opt level: O0

int conn_set_timeout(conn_handle *conn,uint32_t msec)

{
  int *piVar1;
  int *piVar2;
  ulong local_38;
  timeval val;
  int ret;
  conn_priv *priv;
  uint32_t msec_local;
  conn_handle *conn_local;
  
  piVar1 = (int *)conn->priv;
  local_38 = (ulong)msec / 1000;
  val.tv_sec = (__time_t)((msec % 1000) * 1000);
  mutex_lock_shared((mutex_handle *)(piVar1 + 0x24));
  val.tv_usec._4_4_ = setsockopt(*piVar1,1,0x14,&local_38,0x10);
  if (val.tv_usec._4_4_ == -1) {
    piVar2 = __errno_location();
    val.tv_usec._4_4_ = -*piVar2;
  }
  mutex_unlock_shared((mutex_handle *)(piVar1 + 0x24));
  return val.tv_usec._4_4_;
}

Assistant:

int conn_set_timeout(struct conn_handle *conn, uint32_t msec)
{
	struct conn_priv *priv = conn->priv;
	int ret;

#ifdef _WIN32
	const DWORD val = msec;
#else
	struct timeval val;

	val.tv_sec = msec / 1000;
	val.tv_usec = (msec % 1000) * 1000;
#endif

	mutex_lock_shared(&priv->mutex);
	ret = setsockopt(priv->sock_fd, SOL_SOCKET, SO_RCVTIMEO,
			 (const void *)&val, sizeof(val));
	if (ret == SOCKET_ERROR)
		ret = SOCK_ERRNO;

	mutex_unlock_shared(&priv->mutex);

	return ret;
}